

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *inlineeFunctionBody)

{
  NodeBase **addr;
  SListNodeBase<Memory::Recycler> *pSVar1;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  undefined1 local_48 [8];
  Iterator iter;
  
  local_48 = (undefined1  [8])&this->inlineeInfo;
  iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)local_48;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  addr = &iter.current;
  while( true ) {
    if (iter.list == (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    auVar3 = local_48;
    pSVar1 = ((iter.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    iter.current = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((undefined1  [8])iter.current == auVar3) break;
    pSVar1 = ((iter.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    iter.current = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                iter.current;
    pTVar6 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator::
             Data((Iterator *)local_48);
    if ((pTVar6->ptr->functionBody).ptr == inlineeFunctionBody) {
      return pTVar6->ptr;
    }
  }
  return (PolymorphicInlineCacheInfo *)0x0;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo(FunctionBody * inlineeFunctionBody)
    {
        SListCounted<PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(&inlineeInfo);
        while (iter.Next())
        {
            PolymorphicInlineCacheInfo * info = iter.Data();
            if (info->GetFunctionBody() == inlineeFunctionBody)
            {
                return info;
            }
        }

        return nullptr;
    }